

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_shared_object.hpp
# Opt level: O0

type boost::make_shared<JPPVValuePair,boost::shared_ptr<JointPolicyPureVector>&,double&>
               (shared_ptr<JointPolicyPureVector> *arg1,double *args)

{
  sp_ms_deleter<JPPVValuePair> *this;
  void *pvVar1;
  element_type *in_RDX;
  shared_count extraout_RDX;
  sp_counted_base *in_RSI;
  element_type *in_RDI;
  type tVar2;
  JPPVValuePair *pt2;
  void *pv;
  sp_ms_deleter<JPPVValuePair> *pd;
  shared_ptr<JPPVValuePair> pt;
  shared_ptr<JPPVValuePair> *in_stack_ffffffffffffff78;
  element_type *jp;
  JPPVValuePair *this_00;
  JPPVValuePair local_28;
  
  this_00 = &local_28;
  jp = in_RDI;
  local_28._m_jpol.px = in_RDX;
  local_28._m_jpol.pn.pi_ = in_RSI;
  shared_ptr<JPPVValuePair>::
  shared_ptr<JPPVValuePair,boost::detail::sp_inplace_tag<boost::detail::sp_ms_deleter<JPPVValuePair>>>
            ((shared_ptr<JPPVValuePair> *)this_00,0);
  this = (sp_ms_deleter<JPPVValuePair> *)
         shared_ptr<JPPVValuePair>::_internal_get_untyped_deleter
                   ((shared_ptr<JPPVValuePair> *)in_RDI);
  pvVar1 = detail::sp_ms_deleter<JPPVValuePair>::address(this);
  detail::sp_forward<boost::shared_ptr<JointPolicyPureVector>&>
            ((shared_ptr<JointPolicyPureVector> *)local_28._m_jpol.pn.pi_);
  detail::sp_forward<double&>((double *)local_28._m_jpol.px);
  JPPVValuePair::JPPVValuePair(this_00,(JPPV_sharedPtr *)jp,(double)in_RDI);
  detail::sp_ms_deleter<JPPVValuePair>::set_initialized(this);
  detail::sp_enable_shared_from_this(&local_28,pvVar1,pvVar1);
  shared_ptr<JPPVValuePair>::shared_ptr<JPPVValuePair>
            ((shared_ptr<JPPVValuePair> *)in_RDI,in_stack_ffffffffffffff78,(element_type *)0x8d1b6d)
  ;
  shared_ptr<JPPVValuePair>::~shared_ptr((shared_ptr<JPPVValuePair> *)0x8d1b77);
  tVar2.pn.pi_ = extraout_RDX.pi_;
  tVar2.px = jp;
  return tVar2;
}

Assistant:

typename boost::detail::sp_if_not_array< T >::type make_shared( Arg1 && arg1, Args && ... args )
{
    boost::shared_ptr< T > pt( static_cast< T* >( 0 ), BOOST_SP_MSD( T ) );

    boost::detail::sp_ms_deleter< T > * pd = static_cast<boost::detail::sp_ms_deleter< T > *>( pt._internal_get_untyped_deleter() );

    void * pv = pd->address();

    ::new( pv ) T( boost::detail::sp_forward<Arg1>( arg1 ), boost::detail::sp_forward<Args>( args )... );
    pd->set_initialized();

    T * pt2 = static_cast< T* >( pv );

    boost::detail::sp_enable_shared_from_this( &pt, pt2, pt2 );
    return boost::shared_ptr< T >( pt, pt2 );
}